

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

_Bool lz_encoder_init(lzma_mf *mf,lzma_allocator *allocator,lzma_lz_options_conflict *lz_options)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  uint32_t local_2c;
  lzma_lz_options_conflict *lz_options_local;
  lzma_allocator *allocator_local;
  lzma_mf *mf_local;
  
  if (mf->buffer == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)lzma_alloc((ulong)(mf->size + 8),allocator);
    mf->buffer = puVar1;
    if (mf->buffer == (uint8_t *)0x0) {
      return true;
    }
    memset(mf->buffer + mf->size,0,8);
  }
  mf->offset = mf->cyclic_size;
  mf->read_pos = 0;
  mf->read_ahead = 0;
  mf->read_limit = 0;
  mf->write_pos = 0;
  mf->pending = 0;
  if (mf->hash == (uint32_t *)0x0) {
    puVar2 = (uint32_t *)lzma_alloc_zero((ulong)mf->hash_count << 2,allocator);
    mf->hash = puVar2;
    puVar2 = (uint32_t *)lzma_alloc((ulong)mf->sons_count << 2,allocator);
    mf->son = puVar2;
    if ((mf->hash == (uint32_t *)0x0) || (mf->son == (uint32_t *)0x0)) {
      lzma_free(mf->hash,allocator);
      mf->hash = (uint32_t *)0x0;
      lzma_free(mf->son,allocator);
      mf->son = (uint32_t *)0x0;
      return true;
    }
  }
  else {
    memset(mf->hash,0,(ulong)mf->hash_count << 2);
  }
  mf->cyclic_pos = 0;
  if ((lz_options->preset_dict != (uint8_t *)0x0) && (lz_options->preset_dict_size != 0)) {
    if (lz_options->preset_dict_size < mf->size) {
      local_2c = lz_options->preset_dict_size;
    }
    else {
      local_2c = mf->size;
    }
    mf->write_pos = local_2c;
    memcpy(mf->buffer,
           lz_options->preset_dict + ((ulong)lz_options->preset_dict_size - (ulong)mf->write_pos),
           (ulong)mf->write_pos);
    mf->action = LZMA_SYNC_FLUSH;
    (*mf->skip)(mf,mf->write_pos);
  }
  mf->action = LZMA_RUN;
  return false;
}

Assistant:

static bool
lz_encoder_init(lzma_mf *mf, const lzma_allocator *allocator,
		const lzma_lz_options *lz_options)
{
	// Allocate the history buffer.
	if (mf->buffer == NULL) {
		// lzma_memcmplen() is used for the dictionary buffer
		// so we need to allocate a few extra bytes to prevent
		// it from reading past the end of the buffer.
		mf->buffer = lzma_alloc(mf->size + LZMA_MEMCMPLEN_EXTRA,
				allocator);
		if (mf->buffer == NULL)
			return true;

		// Keep Valgrind happy with lzma_memcmplen() and initialize
		// the extra bytes whose value may get read but which will
		// effectively get ignored.
		memzero(mf->buffer + mf->size, LZMA_MEMCMPLEN_EXTRA);
	}

	// Use cyclic_size as initial mf->offset. This allows
	// avoiding a few branches in the match finders. The downside is
	// that match finder needs to be normalized more often, which may
	// hurt performance with huge dictionaries.
	mf->offset = mf->cyclic_size;
	mf->read_pos = 0;
	mf->read_ahead = 0;
	mf->read_limit = 0;
	mf->write_pos = 0;
	mf->pending = 0;

#if UINT32_MAX >= SIZE_MAX / 4
	// Check for integer overflow. (Huge dictionaries are not
	// possible on 32-bit CPU.)
	if (mf->hash_count > SIZE_MAX / sizeof(uint32_t)
			|| mf->sons_count > SIZE_MAX / sizeof(uint32_t))
		return true;
#endif

	// Allocate and initialize the hash table. Since EMPTY_HASH_VALUE
	// is zero, we can use lzma_alloc_zero() or memzero() for mf->hash.
	//
	// We don't need to initialize mf->son, but not doing that may
	// make Valgrind complain in normalization (see normalize() in
	// lz_encoder_mf.c). Skipping the initialization is *very* good
	// when big dictionary is used but only small amount of data gets
	// actually compressed: most of the mf->son won't get actually
	// allocated by the kernel, so we avoid wasting RAM and improve
	// initialization speed a lot.
	if (mf->hash == NULL) {
		mf->hash = lzma_alloc_zero(mf->hash_count * sizeof(uint32_t),
				allocator);
		mf->son = lzma_alloc(mf->sons_count * sizeof(uint32_t),
				allocator);

		if (mf->hash == NULL || mf->son == NULL) {
			lzma_free(mf->hash, allocator);
			mf->hash = NULL;

			lzma_free(mf->son, allocator);
			mf->son = NULL;

			return true;
		}
	} else {
/*
		for (uint32_t i = 0; i < mf->hash_count; ++i)
			mf->hash[i] = EMPTY_HASH_VALUE;
*/
		memzero(mf->hash, mf->hash_count * sizeof(uint32_t));
	}

	mf->cyclic_pos = 0;

	// Handle preset dictionary.
	if (lz_options->preset_dict != NULL
			&& lz_options->preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, use only the tail.
		mf->write_pos = my_min(lz_options->preset_dict_size, mf->size);
		memcpy(mf->buffer, lz_options->preset_dict
				+ lz_options->preset_dict_size - mf->write_pos,
				mf->write_pos);
		mf->action = LZMA_SYNC_FLUSH;
		mf->skip(mf, mf->write_pos);
	}

	mf->action = LZMA_RUN;

	return false;
}